

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizard::setButtonLayout(QWizard *this,QList<QWizard::WizardButton> *layout)

{
  WizardButton which;
  QWizardPrivate *this_00;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  this_00 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  if ((layout->d).size != 0) {
    uVar3 = 0;
    do {
      which = (layout->d).ptr[uVar3];
      if ((which != NoButton) && (which != NButtons)) {
        bVar1 = QWizardPrivate::ensureButton(this_00,which);
        if (!bVar1) {
          return;
        }
        if (uVar3 != 0) {
          uVar2 = 0;
          do {
            if ((layout->d).ptr[uVar2] == which) {
              setButtonLayout();
              return;
            }
            uVar2 = uVar2 + 1;
          } while (uVar3 != uVar2);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)(layout->d).size);
  }
  this_00->buttonsHaveCustomLayout = true;
  QArrayDataPointer<QWizard::WizardButton>::operator=(&(this_00->buttonsCustomLayout).d,&layout->d);
  QWizardPrivate::updateButtonLayout(this_00);
  return;
}

Assistant:

void QWizard::setButtonLayout(const QList<WizardButton> &layout)
{
    Q_D(QWizard);

    for (int i = 0; i < layout.size(); ++i) {
        WizardButton button1 = layout.at(i);

        if (button1 == NoButton || button1 == Stretch)
            continue;
        if (!d->ensureButton(button1))
            return;

        // O(n^2), but n is very small
        for (int j = 0; j < i; ++j) {
            WizardButton button2 = layout.at(j);
            if (Q_UNLIKELY(button2 == button1)) {
                qWarning("QWizard::setButtonLayout: Duplicate button in layout");
                return;
            }
        }
    }

    d->buttonsHaveCustomLayout = true;
    d->buttonsCustomLayout = layout;
    d->updateButtonLayout();
}